

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

void __thiscall wabt::TypeChecker::PrintError(TypeChecker *this,char *fmt,...)

{
  long lVar1;
  TypeChecker *this_00;
  size_t __args;
  char in_AL;
  bool bVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__s;
  size_t __maxlen;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_1b0;
  char acStack_1a8 [8];
  TypeChecker *local_1a0;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  long local_e8;
  size_t length;
  char *buffer;
  char fixed_buf [128];
  va_list args_copy;
  undefined4 uStack_38;
  undefined4 uStack_34;
  va_list args;
  char *fmt_local;
  TypeChecker *this_local;
  
  __s = acStack_1a8;
  if (in_AL != '\0') {
    local_168 = in_XMM0_Da;
    local_158 = in_XMM1_Qa;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  uStack_1b0 = 0x29bbfb;
  local_1a0 = this;
  local_188 = in_RDX;
  local_180 = in_RCX;
  local_178 = in_R8;
  local_170 = in_R9;
  bVar2 = std::function::operator_cast_to_bool((function *)this);
  if (bVar2) {
    args[0].overflow_arg_area = local_198;
    args[0]._0_8_ = &stack0x00000008;
    uStack_34 = 0x30;
    uStack_38 = 0x10;
    fixed_buf[0x78] = '\x10';
    fixed_buf[0x79] = '\0';
    fixed_buf[0x7a] = '\0';
    fixed_buf[0x7b] = '\0';
    fixed_buf[0x7c] = '0';
    fixed_buf[0x7d] = '\0';
    fixed_buf[0x7e] = '\0';
    fixed_buf[0x7f] = '\0';
    length = (size_t)&buffer;
    uStack_1b0 = 0x29bc65;
    iVar3 = vsnprintf((char *)&buffer,0x80,fmt,&uStack_38);
    local_e8 = (long)iVar3;
    if (0x80 < local_e8 + 1U) {
      lVar1 = -(local_e8 + 0x10U & 0xfffffffffffffff0);
      __s = acStack_1a8 + lVar1;
      __maxlen = local_e8 + 1;
      length = (size_t)__s;
      *(undefined8 *)((long)&uStack_1b0 + lVar1) = 0x29bcc3;
      iVar3 = vsnprintf(__s,__maxlen,fmt,fixed_buf + 0x78);
      local_e8 = (long)iVar3;
    }
    __args = length;
    this_00 = local_1a0;
    __s[-8] = -0x1d;
    __s[-7] = -0x44;
    __s[-6] = ')';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    std::function<void_(const_char_*)>::operator()(&this_00->error_callback_,(char *)__args);
  }
  return;
}

Assistant:

void TypeChecker::PrintError(const char* fmt, ...) {
  if (error_callback_) {
    WABT_SNPRINTF_ALLOCA(buffer, length, fmt);
    error_callback_(buffer);
  }
}